

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QString * __thiscall
QCommandLineParser::value
          (QString *__return_storage_ptr__,QCommandLineParser *this,QCommandLineOption *option)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QString> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QCommandLineOption::names((QStringList *)&QStack_38,option);
  value(__return_storage_ptr__,this,QStack_38.ptr);
  QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCommandLineParser::value(const QCommandLineOption &option) const
{
    return value(option.names().constFirst());
}